

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttobjs.c
# Opt level: O0

FT_Error tt_size_reset(TT_Size size,FT_Bool only_height)

{
  TT_Face face_00;
  FT_Int32 FVar1;
  FT_Size_Metrics *__dest;
  FT_Long FVar2;
  FT_Byte *pFVar3;
  FT_Size_Metrics *size_metrics;
  TT_Face face;
  FT_Bool only_height_local;
  TT_Size size_local;
  
  face_00 = (TT_Face)(size->root).face;
  if (face_00->is_cff2 == '\0') {
    (size->ttmetrics).valid = '\0';
    __dest = &size->hinted_metrics;
    memcpy(__dest,&(size->root).metrics,0x38);
    if ((__dest->x_ppem == 0) || ((size->hinted_metrics).y_ppem == 0)) {
      size_local._4_4_ = 0x97;
    }
    else {
      if (((face_00->header).Flags & 8) != 0) {
        FVar1 = FT_MulFix_x86_64((int)(face_00->root).ascender,
                                 (FT_Int32)(size->hinted_metrics).y_scale);
        (size->hinted_metrics).ascender = (long)(int)(FVar1 + 0x20U & 0xffffffc0);
        FVar1 = FT_MulFix_x86_64((int)(face_00->root).descender,
                                 (FT_Int32)(size->hinted_metrics).y_scale);
        (size->hinted_metrics).descender = (long)(int)(FVar1 + 0x20U & 0xffffffc0);
        FVar1 = FT_MulFix_x86_64((int)(face_00->root).height,
                                 (FT_Int32)(size->hinted_metrics).y_scale);
        (size->hinted_metrics).height = (long)(int)(FVar1 + 0x20U & 0xffffffc0);
      }
      (size->ttmetrics).valid = '\x01';
      if (only_height == '\0') {
        if (((face_00->header).Flags & 8) != 0) {
          FVar2 = FT_DivFix((long)(int)((uint)__dest->x_ppem << 6),
                            (ulong)(face_00->root).units_per_EM);
          (size->hinted_metrics).x_scale = FVar2;
          FVar2 = FT_DivFix((long)(int)((uint)(size->hinted_metrics).y_ppem << 6),
                            (ulong)(face_00->root).units_per_EM);
          (size->hinted_metrics).y_scale = FVar2;
          FVar1 = FT_MulFix_x86_64((int)(face_00->root).max_advance_width,
                                   (FT_Int32)(size->hinted_metrics).x_scale);
          (size->hinted_metrics).max_advance = (long)(int)(FVar1 + 0x20U & 0xffffffc0);
        }
        if (__dest->x_ppem < (size->hinted_metrics).y_ppem) {
          (size->ttmetrics).scale = (size->hinted_metrics).y_scale;
          (size->ttmetrics).ppem = (size->hinted_metrics).y_ppem;
          FVar2 = FT_DivFix((ulong)__dest->x_ppem,(ulong)(size->hinted_metrics).y_ppem);
          (size->ttmetrics).x_ratio = FVar2;
          (size->ttmetrics).y_ratio = 0x10000;
        }
        else {
          (size->ttmetrics).scale = (size->hinted_metrics).x_scale;
          (size->ttmetrics).ppem = __dest->x_ppem;
          (size->ttmetrics).x_ratio = 0x10000;
          FVar2 = FT_DivFix((ulong)(size->hinted_metrics).y_ppem,(ulong)__dest->x_ppem);
          (size->ttmetrics).y_ratio = FVar2;
        }
        pFVar3 = tt_face_get_device_metrics(face_00,(uint)__dest->x_ppem,0);
        size->widthp = pFVar3;
        size->metrics = __dest;
        size->cvt_ready = -1;
        size_local._4_4_ = 0;
      }
      else {
        size_local._4_4_ = 0;
      }
    }
  }
  else {
    size_local._4_4_ = 0;
  }
  return size_local._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_size_reset( TT_Size  size,
                 FT_Bool  only_height )
  {
    TT_Face           face;
    FT_Size_Metrics*  size_metrics;


    face = (TT_Face)size->root.face;

    /* nothing to do for CFF2 */
    if ( face->is_cff2 )
      return FT_Err_Ok;

    size->ttmetrics.valid = FALSE;

    size_metrics = &size->hinted_metrics;

    /* copy the result from base layer */
    *size_metrics = size->root.metrics;

    if ( size_metrics->x_ppem < 1 || size_metrics->y_ppem < 1 )
      return FT_THROW( Invalid_PPem );

    /* This bit flag, if set, indicates that the ppems must be       */
    /* rounded to integers.  Nearly all TrueType fonts have this bit */
    /* set, as hinting won't work really well otherwise.             */
    /*                                                               */
    if ( face->header.Flags & 8 )
    {
      /* the TT spec always asks for ROUND, not FLOOR or CEIL */
      size_metrics->ascender = FT_PIX_ROUND(
                                 FT_MulFix( face->root.ascender,
                                            size_metrics->y_scale ) );
      size_metrics->descender = FT_PIX_ROUND(
                                 FT_MulFix( face->root.descender,
                                            size_metrics->y_scale ) );
      size_metrics->height = FT_PIX_ROUND(
                               FT_MulFix( face->root.height,
                                          size_metrics->y_scale ) );
    }

    size->ttmetrics.valid = TRUE;

    if ( only_height )
    {
      /* we must not recompute the scaling values here since       */
      /* `tt_size_reset' was already called (with only_height = 0) */
      return FT_Err_Ok;
    }

    if ( face->header.Flags & 8 )
    {
      /* base scaling values on integer ppem values, */
      /* as mandated by the TrueType specification   */
      size_metrics->x_scale = FT_DivFix( size_metrics->x_ppem << 6,
                                         face->root.units_per_EM );
      size_metrics->y_scale = FT_DivFix( size_metrics->y_ppem << 6,
                                         face->root.units_per_EM );

      size_metrics->max_advance = FT_PIX_ROUND(
                                    FT_MulFix( face->root.max_advance_width,
                                               size_metrics->x_scale ) );
    }

    /* compute new transformation */
    if ( size_metrics->x_ppem >= size_metrics->y_ppem )
    {
      size->ttmetrics.scale   = size_metrics->x_scale;
      size->ttmetrics.ppem    = size_metrics->x_ppem;
      size->ttmetrics.x_ratio = 0x10000L;
      size->ttmetrics.y_ratio = FT_DivFix( size_metrics->y_ppem,
                                           size_metrics->x_ppem );
    }
    else
    {
      size->ttmetrics.scale   = size_metrics->y_scale;
      size->ttmetrics.ppem    = size_metrics->y_ppem;
      size->ttmetrics.x_ratio = FT_DivFix( size_metrics->x_ppem,
                                           size_metrics->y_ppem );
      size->ttmetrics.y_ratio = 0x10000L;
    }

    size->widthp = tt_face_get_device_metrics( face, size_metrics->x_ppem, 0 );

    size->metrics = size_metrics;

#ifdef TT_USE_BYTECODE_INTERPRETER
    size->cvt_ready = -1;
#endif /* TT_USE_BYTECODE_INTERPRETER */

    return FT_Err_Ok;
  }